

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  bool bVar1;
  const_iterator key;
  Value *in_RSI;
  vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *in_RDI;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  ArrayIndex in_stack_000001c4;
  Value *in_stack_000001c8;
  Value *in_stack_ffffffffffffffd0;
  
  key = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(in_RDI);
  while( true ) {
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (Value *)__gnu_cxx::
                  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  ::operator*((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                               *)&stack0xffffffffffffffe0);
    if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindIndex) {
      bVar1 = Value::isArray(in_RSI);
      if (bVar1) {
        Value::isValidIndex(in_stack_ffffffffffffffd0,(ArrayIndex)((ulong)in_RDI >> 0x20));
      }
      in_RSI = Value::operator[](in_stack_000001c8,in_stack_000001c4);
    }
    else if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindKey) {
      Value::isObject(in_RSI);
      in_RSI = Value::operator[](in_RSI,&(key._M_current)->key_);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return in_RSI;
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullRef) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
      }
    }
  }
  return *node;
}